

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void co_free(stCoRoutine_t *co)

{
  stCoRoutine_t *co_local;
  
  if (co->cIsShareStack == '\0') {
    free(co->stack_mem->stack_buffer);
    free(co->stack_mem);
  }
  else {
    if (co->save_buffer != (char *)0x0) {
      free(co->save_buffer);
    }
    if (co->stack_mem->occupy_co == co) {
      co->stack_mem->occupy_co = (stCoRoutine_t *)0x0;
    }
  }
  free(co);
  return;
}

Assistant:

void co_free( stCoRoutine_t *co )
{
    if (!co->cIsShareStack) 
    {    
        free(co->stack_mem->stack_buffer);
        free(co->stack_mem);
    }   
    //walkerdu fix at 2018-01-20
    //存在内存泄漏
    else 
    {
        if(co->save_buffer)
            free(co->save_buffer);

        if(co->stack_mem->occupy_co == co)
            co->stack_mem->occupy_co = NULL;
    }

    free( co );
}